

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Choice.cxx
# Opt level: O2

void __thiscall Fl_Choice::draw(Fl_Choice *this)

{
  Fl_Menu_Item *pFVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Fl_Color FVar7;
  Fl_Color FVar8;
  int iVar9;
  _func_int **pp_Var10;
  int iVar11;
  uint uVar12;
  Fl_Boxtype t;
  int H;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  Fl_Menu_Item m;
  Fl_Label local_60;
  
  t = (Fl::scheme_ == (char *)0x0) + FL_UP_BOX;
  iVar2 = Fl::box_dx(t);
  iVar3 = Fl::box_dy(t);
  H = (this->super_Fl_Menu_).super_Fl_Widget.h_ + iVar3 * -2;
  iVar4 = Fl::is_scheme("gtk+");
  iVar11 = 0x14;
  if ((iVar4 == 0) && (iVar4 = Fl::is_scheme("gleam"), iVar4 == 0)) {
    Fl::is_scheme("plastic");
    iVar11 = 0x14;
    if (H < 0x14) {
      iVar11 = H;
    }
  }
  iVar4 = (((this->super_Fl_Menu_).super_Fl_Widget.x_ - iVar11) - iVar2) +
          (this->super_Fl_Menu_).super_Fl_Widget.w_;
  iVar16 = (this->super_Fl_Menu_).super_Fl_Widget.y_ + iVar3;
  uVar5 = (iVar11 + -4) / 3;
  uVar12 = 1;
  if (1 < (int)uVar5) {
    uVar12 = uVar5;
  }
  uVar5 = uVar12 * 2;
  uVar6 = (int)(~uVar5 + iVar11) / 2 + iVar4;
  uVar13 = (int)(~uVar12 + H) / 2 + iVar16;
  if (Fl::scheme_ == (char *)0x0) {
    FVar8 = fl_contrast((this->super_Fl_Menu_).textcolor_,7);
    FVar7 = 7;
    if (FVar8 != (this->super_Fl_Menu_).textcolor_) {
      FVar7 = fl_lighter((this->super_Fl_Menu_).super_Fl_Widget.color_);
    }
    Fl_Widget::draw_box((Fl_Widget *)this,t,FVar7);
    Fl_Widget::draw_box((Fl_Widget *)this,FL_UP_BOX,iVar4,iVar16,iVar11,H,
                        (this->super_Fl_Menu_).super_Fl_Widget.color_);
    iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
    FVar7 = (this->super_Fl_Menu_).super_Fl_Widget.label_.color;
    if (iVar4 == 0) {
      FVar7 = fl_inactive(FVar7);
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar7);
    uVar14 = uVar12 + uVar13;
    pp_Var10 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
LAB_001a9591:
    (*pp_Var10[0x16])(fl_graphics_driver,(ulong)uVar6,(ulong)uVar13,(ulong)(uVar6 + uVar12),
                      (ulong)uVar14,(ulong)(uVar5 + uVar6),uVar13);
  }
  else {
    Fl_Widget::draw_box((Fl_Widget *)this,t,(this->super_Fl_Menu_).super_Fl_Widget.color_);
    iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
    FVar7 = (this->super_Fl_Menu_).super_Fl_Widget.label_.color;
    if (iVar4 == 0) {
      FVar7 = fl_inactive(FVar7);
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar7);
    iVar4 = Fl::is_scheme("plastic");
    if (iVar4 != 0) {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x16])
                (fl_graphics_driver,(ulong)uVar6,(ulong)(uVar13 + 3),(ulong)(uVar6 + uVar12),
                 (ulong)(uVar13 + uVar12 + 3),(ulong)(uVar5 + uVar6),uVar13 + 3);
      uVar14 = (uVar13 - uVar12) + 1;
      pp_Var10 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
      uVar13 = uVar13 + 1;
      goto LAB_001a9591;
    }
    iVar4 = (this->super_Fl_Menu_).super_Fl_Widget.w_;
    iVar16 = (this->super_Fl_Menu_).super_Fl_Widget.y_;
    iVar15 = (this->super_Fl_Menu_).super_Fl_Widget.x_ - iVar2;
    iVar9 = (this->super_Fl_Menu_).super_Fl_Widget.h_ / 2;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x16])();
    uVar12 = iVar9 + iVar16 + 2;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x16])
              (fl_graphics_driver,iVar4 + iVar15 + -0xd,(ulong)uVar12,
               (ulong)(uint)(iVar15 + -10 + iVar4),(ulong)(uint)(iVar9 + 5 + iVar16),
               (ulong)(uint)(iVar15 + -7 + iVar4),uVar12);
    FVar7 = fl_darker((this->super_Fl_Menu_).super_Fl_Widget.color_);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar7);
    uVar12 = iVar9 + -8 + iVar16;
    uVar5 = iVar9 + 8 + iVar16;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
              (fl_graphics_driver,(ulong)((iVar4 + iVar15) - 0x14),(ulong)uVar12,(ulong)uVar5);
    FVar7 = fl_lighter((this->super_Fl_Menu_).super_Fl_Widget.color_);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar7);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
              (fl_graphics_driver,(ulong)((iVar4 + iVar15) - 0x13),(ulong)uVar12,(ulong)uVar5);
  }
  pFVar1 = (this->super_Fl_Menu_).value_;
  if (pFVar1 == (Fl_Menu_Item *)0x0) goto LAB_001a9878;
  m.labelcolor_ = pFVar1->labelcolor_;
  m._52_4_ = *(undefined4 *)&pFVar1->field_0x34;
  m.text = pFVar1->text;
  m.shortcut_ = pFVar1->shortcut_;
  m._12_4_ = *(undefined4 *)&pFVar1->field_0xc;
  m.callback_ = pFVar1->callback_;
  m.user_data_ = pFVar1->user_data_;
  m.flags = pFVar1->flags;
  m.labeltype_ = pFVar1->labeltype_;
  m._37_3_ = *(undefined3 *)&pFVar1->field_0x25;
  m.labelfont_ = pFVar1->labelfont_;
  m.labelsize_ = pFVar1->labelsize_;
  iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
  m.flags = (uint)(iVar4 == 0) | m.flags & 0xfffffffeU;
  uVar13 = (this->super_Fl_Menu_).super_Fl_Widget.x_ + iVar2;
  uVar5 = iVar3 + (this->super_Fl_Menu_).super_Fl_Widget.y_ + 1;
  uVar6 = (this->super_Fl_Menu_).super_Fl_Widget.w_ - (iVar11 + iVar2 * 2);
  uVar12 = H - 2;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
            (fl_graphics_driver,(ulong)uVar13,(ulong)uVar5,(ulong)uVar6,(ulong)uVar12);
  if (Fl::scheme_ == (char *)0x0) {
    fl_draw_shortcut = '\x02';
    Fl_Menu_Item::draw(&m,uVar13,uVar5,uVar6,uVar12,&this->super_Fl_Menu_,
                       (uint)(Fl::focus_ == (Fl_Widget *)this));
    fl_draw_shortcut = '\0';
  }
  else {
    local_60.value = m.text;
    local_60.image = (Fl_Image *)0x0;
    local_60.deimage = (Fl_Image *)0x0;
    local_60.type = m.labeltype_;
    if (m.labelsize_ == 0 && m.labelfont_ == 0) {
      local_60.font = (this->super_Fl_Menu_).textfont_;
LAB_001a97d7:
      local_60.size = (this->super_Fl_Menu_).textsize_;
    }
    else {
      local_60.font = m.labelfont_;
      local_60.size = m.labelsize_;
      if (m.labelsize_ == 0) goto LAB_001a97d7;
    }
    local_60.color = m.labelcolor_;
    if (m.labelcolor_ == 0) {
      local_60.color = (this->super_Fl_Menu_).textcolor_;
    }
    if (iVar4 == 0) {
      local_60.color = fl_inactive(local_60.color);
    }
    fl_draw_shortcut = '\x02';
    iVar11 = 0;
    if (6 < (int)uVar6) {
      iVar11 = uVar6 - 6;
    }
    Fl_Label::draw(&local_60,uVar13 + 3,uVar5,iVar11,uVar12,4);
    fl_draw_shortcut = '\0';
    if (Fl::focus_ == (Fl_Widget *)this) {
      Fl_Widget::draw_focus
                ((Fl_Widget *)this,(uint)(this->super_Fl_Menu_).super_Fl_Widget.box_,uVar13,uVar5,
                 uVar6,uVar12);
    }
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
LAB_001a9878:
  Fl_Widget::draw_label((Fl_Widget *)this);
  return;
}

Assistant:

void Fl_Choice::draw() {
  Fl_Boxtype btype = Fl::scheme() ? FL_UP_BOX		// non-default uses up box
                                  : FL_DOWN_BOX;	// default scheme uses down box
  int dx = Fl::box_dx(btype);
  int dy = Fl::box_dy(btype);

  // Arrow area
  int H = h() - 2 * dy;
  int W = Fl::is_scheme("gtk+")    ? 20 :			// gtk+  -- fixed size
          Fl::is_scheme("gleam")   ? 20 :			// gleam -- fixed size
          Fl::is_scheme("plastic") ? ((H > 20) ? 20 : H)	// plastic: shrink if H<20
                                   : ((H > 20) ? 20 : H);	// default: shrink if H<20
  int X = x() + w() - W - dx;
  int Y = y() + dy;

  // Arrow object
  int w1 = (W - 4) / 3; if (w1 < 1) w1 = 1;
  int x1 = X + (W - 2 * w1 - 1) / 2;
  int y1 = Y + (H - w1 - 1) / 2;

  if (Fl::scheme()) {
    // NON-DEFAULT SCHEME

    // Draw widget box
    draw_box(btype, color());

    // Draw arrow area
    fl_color(active_r() ? labelcolor() : fl_inactive(labelcolor()));
    if (Fl::is_scheme("plastic")) {
      // Show larger up/down arrows...
      fl_polygon(x1, y1 + 3, x1 + w1, y1 + w1 + 3, x1 + 2 * w1, y1 + 3);
      fl_polygon(x1, y1 + 1, x1 + w1, y1 - w1 + 1, x1 + 2 * w1, y1 + 1);
    } else {
      // Show smaller up/down arrows with a divider...
      x1 = x() + w() - 13 - dx;
      y1 = y() + h() / 2;
      fl_polygon(x1, y1 - 2, x1 + 3, y1 - 5, x1 + 6, y1 - 2);
      fl_polygon(x1, y1 + 2, x1 + 3, y1 + 5, x1 + 6, y1 + 2);

      fl_color(fl_darker(color()));
      fl_yxline(x1 - 7, y1 - 8, y1 + 8);

      fl_color(fl_lighter(color()));
      fl_yxline(x1 - 6, y1 - 8, y1 + 8);
    }
  } else {
    // DEFAULT SCHEME

    // Draw widget box
    if (fl_contrast(textcolor(), FL_BACKGROUND2_COLOR) == textcolor()) {
      draw_box(btype, FL_BACKGROUND2_COLOR);
    } else {
      draw_box(btype, fl_lighter(color()));
    }

    // Draw arrow area
    draw_box(FL_UP_BOX,X,Y,W,H,color());
    fl_color(active_r() ? labelcolor() : fl_inactive(labelcolor()));
    fl_polygon(x1, y1, x1 + w1, y1 + w1, x1 + 2 * w1, y1);
  }

  W += 2 * dx;

  // Draw menu item's label
  if (mvalue()) {
    Fl_Menu_Item m = *mvalue();
    if (active_r()) m.activate(); else m.deactivate();

    // Clip
    int xx = x() + dx, yy = y() + dy + 1, ww = w() - W, hh = H - 2;
    fl_push_clip(xx, yy, ww, hh);

    if ( Fl::scheme()) {
      Fl_Label l;
      l.value = m.text;
      l.image = 0;
      l.deimage = 0;
      l.type = m.labeltype_;
      l.font = m.labelsize_ || m.labelfont_ ? m.labelfont_ : textfont();
      l.size = m.labelsize_ ? m.labelsize_ : textsize();
      l.color= m.labelcolor_ ? m.labelcolor_ : textcolor();
      if (!m.active()) l.color = fl_inactive((Fl_Color)l.color);
      fl_draw_shortcut = 2; // hack value to make '&' disappear
      l.draw(xx+3, yy, ww>6 ? ww-6 : 0, hh, FL_ALIGN_LEFT);
      fl_draw_shortcut = 0;
      if ( Fl::focus() == this ) draw_focus(box(), xx, yy, ww, hh);
    }
    else {
      fl_draw_shortcut = 2; // hack value to make '&' disappear
      m.draw(xx, yy, ww, hh, this, Fl::focus() == this);
      fl_draw_shortcut = 0;
    }

    fl_pop_clip();
  }

  // Widget's label
  draw_label();
}